

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall CSourceFilesProcessor::processFile(CSourceFilesProcessor *this,string *fileName)

{
  CScanner *this_00;
  long *plVar1;
  allocator local_41;
  char c;
  
  std::ifstream::open((string *)&this->file,(_Ios_Openmode)fileName);
  this_00 = &this->scanner;
  Refal2::CError::SetFileName((CError *)this_00,fileName);
  if (*(int *)(&this->field_0x1fb8 + *(long *)(*(long *)&this->file + -0x18)) == 0) {
    while (plVar1 = (long *)std::istream::get((char *)&this->file),
          (*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) == 0) {
      Refal2::CScanner::AddChar(this_00,c);
    }
    if (*(TErrorSeverity *)
         ((long)&(this->scanner).super_CParser.super_CDirectiveParser.super_CRuleParser.
                 super_CQualifierParser.super_CModuleBuilder.super_CProgramBuilder + 0xa0) !=
        ES_FatalError) {
      Refal2::CScanner::AddEndOfFile(this_00);
    }
  }
  else {
    std::__cxx11::string::string((string *)&c,"no such file",&local_41);
    Refal2::CErrorsHelper::RaiseError((CErrorsHelper *)this_00,ES_FatalError,(string *)&c);
    std::__cxx11::string::~string((string *)&c);
  }
  Refal2::CError::ResetFileName((CError *)this_00);
  std::ifstream::close();
  return;
}

Assistant:

void CSourceFilesProcessor::processFile( const std::string& fileName )
{
	file.open( fileName );
	scanner.SetFileName( fileName );
	if( file.good() ) {
		for( char c; file.get( c ); ) {
			scanner.AddChar( c );
		}
		if( scanner.ErrorSeverity() != ES_FatalError ) {
			scanner.AddEndOfFile();
		}
	} else {
		scanner.RaiseError( ES_FatalError, "no such file" );
	}
	scanner.ResetFileName();
	file.close();
}